

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::adv_thread_pool::anon_unknown_6::real_private_dispatcher_t::~real_private_dispatcher_t
          (real_private_dispatcher_t *this)

{
  real_private_dispatcher_t *this_local;
  
  ~real_private_dispatcher_t(this);
  operator_delete(this);
  return;
}

Assistant:

~real_private_dispatcher_t()
			{
				m_disp->shutdown();
				m_disp->wait();
			}